

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModuleDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::ModuleDeclarationSyntax_const&>
          (BumpAllocator *this,ModuleDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ModuleDeclarationSyntax *pMVar8;
  
  pMVar8 = (ModuleDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModuleDeclarationSyntax *)this->endPtr < pMVar8 + 1) {
    pMVar8 = (ModuleDeclarationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pMVar8 + 1);
  }
  (pMVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pMVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pMVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pMVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f0b8;
  (pMVar8->header).ptr = (args->header).ptr;
  uVar4 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar8->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pMVar8->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pMVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pMVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar8->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f728
  ;
  uVar5 = (args->endmodule).field_0x2;
  NVar6.raw = (args->endmodule).numFlags.raw;
  uVar7 = (args->endmodule).rawLen;
  pIVar3 = (args->endmodule).info;
  (pMVar8->endmodule).kind = (args->endmodule).kind;
  (pMVar8->endmodule).field_0x2 = uVar5;
  (pMVar8->endmodule).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->endmodule).rawLen = uVar7;
  (pMVar8->endmodule).info = pIVar3;
  pMVar8->blockName = args->blockName;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }